

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Variable *
soul::BlockBuilder::createVariable<soul::Identifier>
          (Module *m,Type *type,Identifier *name,Role role)

{
  Variable *pVVar1;
  Role local_2c;
  CodeLocation local_28;
  Identifier local_18;
  
  local_28.sourceCode.object = (SourceCodeText *)0x0;
  local_28.location.data = (char *)0x0;
  local_2c = role;
  local_18 = Identifier::Pool::get(&m->allocator->identifiers,name);
  pVVar1 = Module::
           allocate<soul::heart::Variable,soul::CodeLocation,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                     (m,&local_28,type,&local_18,&local_2c);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_28.sourceCode);
  return pVVar1;
}

Assistant:

static heart::Variable& createVariable (Module& m, Type type, StringType&& name, heart::Variable::Role role)
    {
        return m.allocate<heart::Variable> (CodeLocation(), std::move (type), m.allocator.get (name), role);
    }